

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polyedgecurve.cpp
# Opt level: O0

bool __thiscall ON_PolyEdgeCurve::ContainsAllEdges(ON_PolyEdgeCurve *this)

{
  int iVar1;
  ON_PolyEdgeSegment *this_00;
  ON_BrepEdge *pOVar2;
  ON_PolyEdgeSegment *segment;
  int count;
  int i;
  ON_PolyEdgeCurve *this_local;
  
  iVar1 = SegmentCount(this);
  segment._4_4_ = 0;
  while( true ) {
    if (iVar1 <= segment._4_4_) {
      return true;
    }
    this_00 = SegmentCurve(this,segment._4_4_);
    if ((this_00 == (ON_PolyEdgeSegment *)0x0) ||
       (pOVar2 = ON_PolyEdgeSegment::BrepEdge(this_00), pOVar2 == (ON_BrepEdge *)0x0)) break;
    segment._4_4_ = segment._4_4_ + 1;
  }
  return false;
}

Assistant:

bool ON_PolyEdgeCurve::ContainsAllEdges() const
{
  int i, count = SegmentCount();
  for( i = 0; i < count; i++)
  {
    ON_PolyEdgeSegment* segment = SegmentCurve(i);
    if( nullptr == segment || nullptr == segment->BrepEdge())
    {
      return false;
    }
  }
  return true;
}